

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall TPZMatrix<long_double>::Decompose_Cholesky(TPZMatrix<long_double> *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar8;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar9;
  longdouble in_ST7;
  double __x;
  longdouble tmp2;
  char *in_stack_000000c0;
  longdouble sum_1;
  int64_t k_1;
  int64_t j;
  longdouble tmp;
  longdouble sum;
  int64_t k;
  int64_t i;
  int64_t dim;
  undefined8 uVar10;
  undefined2 uVar11;
  undefined6 in_stack_fffffffffffffec2;
  undefined2 in_stack_fffffffffffffec8;
  undefined6 uStack_136;
  undefined1 local_b8 [16];
  longdouble local_a8 [2];
  longdouble local_88;
  longdouble local_78;
  long local_68;
  long local_60;
  undefined1 local_58 [16];
  longdouble local_48;
  longdouble local_38;
  long local_28;
  long local_20;
  long local_18;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_000000c0,stack0x000000b8);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar5 != iVar6) {
      Error(in_stack_000000c0,stack0x000000b8);
    }
    iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_18 = CONCAT44(extraout_var,iVar4);
    for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
      lVar7 = in_ST2;
      in_ST2 = in_ST4;
      lVar8 = in_ST5;
      in_ST4 = in_ST6;
      in_ST5 = in_ST7;
      for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
        local_38 = (longdouble)0;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_28);
        lVar1 = local_20;
        local_38 = local_38 + in_ST0 * in_ST1;
        in_ST0 = in_ST3;
        in_ST1 = in_ST2;
        in_ST3 = in_ST4;
        in_ST2 = in_ST4;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20);
        local_48 = lVar7 - local_38;
        lVar9 = in_ST4;
        in_ST5 = in_ST4;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,lVar1,&local_48);
        lVar7 = lVar8;
        lVar8 = in_ST4;
        in_ST4 = lVar9;
      }
      in_ST1 = in_ST3;
      in_ST3 = lVar8;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20);
      uVar10 = SUB108(in_ST0,0);
      uVar11 = (undefined2)((unkuint10)in_ST0 >> 0x40);
      in_ST0 = lVar7;
      in_ST6 = in_ST5;
      std::sqrt(__x);
      in_ST7 = in_ST6;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_RDI,local_20,local_20,local_58,in_R8,in_R9,uVar10,uVar11);
      local_60 = local_20;
      while (local_60 = local_60 + 1, local_60 < local_18) {
        lVar7 = in_ST2;
        lVar8 = in_ST5;
        in_ST2 = in_ST6;
        for (local_68 = 0; local_68 < local_20; local_68 = local_68 + 1) {
          local_78 = (longdouble)0;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_68);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_60,local_68);
          lVar2 = local_20;
          lVar1 = local_60;
          local_78 = local_78 + in_ST0 * in_ST1;
          in_ST0 = in_ST3;
          in_ST1 = in_ST4;
          in_ST3 = in_ST2;
          in_ST4 = in_ST2;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])();
          local_88 = lVar7 - local_78;
          lVar9 = in_ST2;
          in_ST7 = in_ST2;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar2,lVar1,&local_88);
          lVar7 = lVar8;
          lVar8 = in_ST2;
          in_ST2 = lVar9;
        }
        in_ST3 = in_ST7;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20);
        uVar10 = SUB108(in_ST0,0);
        lVar9 = in_ST3;
        bVar3 = IsZero((longdouble)
                       CONCAT28(in_stack_fffffffffffffec8,
                                CONCAT62(in_stack_fffffffffffffec2,
                                         (short)((unkuint10)in_ST0 >> 0x40))));
        in_ST0 = in_ST4;
        if (bVar3) {
          Error(in_stack_000000c0,stack0x000000b8);
          in_ST0 = in_ST4;
        }
        in_ST4 = lVar9;
        lVar1 = local_60;
        in_stack_fffffffffffffec8 = (undefined2)local_20;
        uStack_136 = (undefined6)((ulong)local_20 >> 0x10);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])();
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20);
        local_a8[0] = in_ST1 / lVar7;
        in_ST5 = in_ST4;
        in_ST6 = in_ST4;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,CONCAT62(uStack_136,in_stack_fffffffffffffec8),lVar1,local_a8,in_R8,in_R9,
                   uVar10);
        lVar2 = local_20;
        lVar1 = local_60;
        in_ST1 = lVar8;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])();
        in_ST7 = in_ST6;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,lVar2,local_b8);
      }
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}